

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

void insert_heap(U32Pair *min_heap,u32 index,u32 value,u32 count)

{
  uint uVar1;
  u32 parent;
  u32 count_local;
  u32 value_local;
  u32 index_local;
  U32Pair *min_heap_local;
  
  min_heap[index].value = value;
  min_heap[index].count = count;
  count_local = index;
  while ((count_local != 0 &&
         (uVar1 = count_local - 1 >> 1, min_heap[count_local].count < min_heap[uVar1].count))) {
    swap_pair(min_heap + uVar1,min_heap + count_local);
    count_local = uVar1;
  }
  return;
}

Assistant:

void insert_heap(U32Pair* min_heap, u32 index, u32 value, u32 count) {
  min_heap[index].value = value;
  min_heap[index].count = count;
  while (index > 0) {
    u32 parent = (index - 1) / 2;
    if (min_heap[parent].count <= min_heap[index].count) {
      break;
    }
    swap_pair(&min_heap[parent], &min_heap[index]);
    index = parent;
  }
}